

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

char * CVodeGetLinReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  
  pcVar1 = (char *)malloc(0x1e);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1 + 5,"SUCCESS",8);
    uVar2 = 0x4355535f534c5643;
    break;
  default:
    builtin_strncpy(pcVar1,"NONE",5);
    return pcVar1;
  case -9:
    builtin_strncpy(pcVar1,"CVLS_SUNLS_FAIL",0x10);
    return pcVar1;
  case -8:
    builtin_strncpy(pcVar1,"CVLS_SUNMAT_FAIL",0x11);
    return pcVar1;
  case -7:
    builtin_strncpy(pcVar1,"CVLS_JACFUNC_RECVR",0x13);
    return pcVar1;
  case -6:
    builtin_strncpy(pcVar1,"CVLS_JACFUNC_UNRECVR",0x15);
    return pcVar1;
  case -5:
    builtin_strncpy(pcVar1 + 7,"EM_NULL",8);
    uVar2 = 0x454d505f534c5643;
    break;
  case -4:
    uVar2 = 0x4c4941465f4d45;
    goto LAB_001164e5;
  case -3:
    builtin_strncpy(pcVar1 + 7,"L_INPUT",8);
    uVar2 = 0x4c4c495f534c5643;
    break;
  case -2:
    builtin_strncpy(pcVar1 + 7,"EM_NULL",8);
    uVar2 = 0x454d4c5f534c5643;
    break;
  case -1:
    uVar2 = 0x4c4c554e5f4d45;
LAB_001164e5:
    *(undefined8 *)(pcVar1 + 6) = uVar2;
    uVar2 = 0x4d454d5f534c5643;
  }
  *(undefined8 *)pcVar1 = uVar2;
  return pcVar1;
}

Assistant:

char* CVodeGetLinReturnFlagName(long int flag)
{
  char* name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case CVLS_SUCCESS: sprintf(name, "CVLS_SUCCESS"); break;
  case CVLS_MEM_NULL: sprintf(name, "CVLS_MEM_NULL"); break;
  case CVLS_LMEM_NULL: sprintf(name, "CVLS_LMEM_NULL"); break;
  case CVLS_ILL_INPUT: sprintf(name, "CVLS_ILL_INPUT"); break;
  case CVLS_MEM_FAIL: sprintf(name, "CVLS_MEM_FAIL"); break;
  case CVLS_PMEM_NULL: sprintf(name, "CVLS_PMEM_NULL"); break;
  case CVLS_JACFUNC_UNRECVR: sprintf(name, "CVLS_JACFUNC_UNRECVR"); break;
  case CVLS_JACFUNC_RECVR: sprintf(name, "CVLS_JACFUNC_RECVR"); break;
  case CVLS_SUNMAT_FAIL: sprintf(name, "CVLS_SUNMAT_FAIL"); break;
  case CVLS_SUNLS_FAIL: sprintf(name, "CVLS_SUNLS_FAIL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}